

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O0

ostream * operator<<(ostream *os,ResultValueType value)

{
  ResultValueType value_local;
  ostream *os_local;
  
  switch(value) {
  case NONE:
    std::operator<<(os,"NONE");
    break;
  case FLOAT:
    std::operator<<(os,"FLOAT");
    break;
  case INTEGER:
    std::operator<<(os,"INTEGER");
    break;
  case COMPLEX:
    std::operator<<(os,"COMPLEX");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValueType value) {
	switch (value) {
	case ResultValueType::NONE:
		os << "NONE";
		break;
	case ResultValueType::INTEGER:
		os << "INTEGER";
		break;
	case ResultValueType::FLOAT:
		os << "FLOAT";
		break;
	case ResultValueType::COMPLEX:
		os << "COMPLEX";
		break;
	}
	return os;
}